

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_avm(REF_GRID ref_grid,char *filename)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  REF_STATUS RVar5;
  size_t sVar6;
  size_t sVar7;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_BOOL pad_3;
  REF_INT faceid_4;
  REF_BOOL select_faceid_3;
  REF_BOOL sixty_four_bit_3;
  REF_BOOL swap_endian_4;
  REF_BOOL always_id_3;
  REF_BOOL faceid_insted_of_c2n_3;
  REF_CELL ref_cell_3;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT temp_node;
  REF_INT cell_2;
  REF_BOOL pad_2;
  REF_INT faceid_3;
  REF_BOOL select_faceid_2;
  REF_BOOL sixty_four_bit_2;
  REF_BOOL swap_endian_3;
  REF_BOOL always_id_2;
  REF_BOOL faceid_insted_of_c2n_2;
  REF_CELL ref_cell_2;
  int local_588;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_INT cell_1;
  REF_BOOL pad_1;
  REF_INT faceid_2;
  REF_BOOL select_faceid_1;
  REF_BOOL sixty_four_bit_1;
  REF_BOOL swap_endian_2;
  REF_BOOL always_id_1;
  REF_BOOL faceid_insted_of_c2n_1;
  REF_CELL ref_cell_1;
  int local_558;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INT cell;
  REF_BOOL pad;
  REF_INT faceid_1;
  REF_BOOL select_faceid;
  REF_BOOL sixty_four_bit;
  REF_BOOL swap_endian_1;
  REF_BOOL always_id;
  REF_BOOL faceid_insted_of_c2n;
  REF_CELL ref_cell;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_BOOL twod;
  REF_INT version;
  REF_BOOL swap_endian;
  REF_LONG ref_private_status_reis_bi_54;
  REF_LONG ref_private_status_reis_ai_54;
  REF_LONG ref_private_status_reis_bi_53;
  REF_LONG ref_private_status_reis_ai_53;
  REF_LONG ref_private_status_reis_bi_52;
  REF_LONG ref_private_status_reis_ai_52;
  REF_LONG ref_private_status_reis_bi_51;
  REF_LONG ref_private_status_reis_ai_51;
  REF_LONG ref_private_status_reis_bi_50;
  REF_LONG ref_private_status_reis_ai_50;
  REF_INT ref_geom_type;
  REF_STATUS ref_status_3;
  char patch_label_index [33];
  char *unknown_patch_type;
  char *patch_type;
  char *patch_label;
  REF_GEOM ref_geom;
  REF_LONG ref_private_status_reis_bi_49;
  REF_LONG ref_private_status_reis_ai_49;
  REF_LONG ref_private_status_reis_bi_48;
  REF_LONG ref_private_status_reis_ai_48;
  REF_LONG ref_private_status_reis_bi_47;
  REF_LONG ref_private_status_reis_ai_47;
  REF_LONG ref_private_status_reis_bi_46;
  REF_LONG ref_private_status_reis_ai_46;
  REF_LONG ref_private_status_reis_bi_45;
  REF_LONG ref_private_status_reis_ai_45;
  REF_LONG ref_private_status_reis_bi_44;
  REF_LONG ref_private_status_reis_ai_44;
  REF_LONG ref_private_status_reis_bi_43;
  REF_LONG ref_private_status_reis_ai_43;
  REF_LONG ref_private_status_reis_bi_42;
  REF_LONG ref_private_status_reis_ai_42;
  REF_LONG ref_private_status_reis_bi_41;
  REF_LONG ref_private_status_reis_ai_41;
  REF_LONG ref_private_status_reis_bi_40;
  REF_LONG ref_private_status_reis_ai_40;
  REF_LONG ref_private_status_reis_bi_39;
  REF_LONG ref_private_status_reis_ai_39;
  REF_LONG ref_private_status_reis_bi_38;
  REF_LONG ref_private_status_reis_ai_38;
  REF_LONG ref_private_status_reis_bi_37;
  REF_LONG ref_private_status_reis_ai_37;
  REF_LONG ref_private_status_reis_bi_36;
  REF_LONG ref_private_status_reis_ai_36;
  REF_LONG ref_private_status_reis_bi_35;
  REF_LONG ref_private_status_reis_ai_35;
  REF_LONG ref_private_status_reis_bi_34;
  REF_LONG ref_private_status_reis_ai_34;
  REF_LONG ref_private_status_reis_bi_33;
  REF_LONG ref_private_status_reis_ai_33;
  REF_LONG ref_private_status_reis_bi_32;
  REF_LONG ref_private_status_reis_ai_32;
  REF_LONG ref_private_status_reis_bi_31;
  REF_LONG ref_private_status_reis_ai_31;
  REF_LONG ref_private_status_reis_bi_30;
  REF_LONG ref_private_status_reis_ai_30;
  REF_LONG ref_private_status_reis_bi_29;
  REF_LONG ref_private_status_reis_ai_29;
  REF_LONG ref_private_status_reis_bi_28;
  REF_LONG ref_private_status_reis_ai_28;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_DBL *pRStack_2a8;
  REF_STATUS ref_status_2;
  REF_DBL *reference;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_status_1;
  char *unit;
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_status;
  char *coord_system;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int faceid;
  char element_scheme [8];
  int n_int;
  int refined;
  char mesh_units [12];
  double model_scale;
  char mesh_description [22];
  char ref_point_desc [1];
  char coordinate_system [7];
  char mesh_generator [7];
  char mesh_type [8];
  char mesh_name [16];
  char local_bf [7];
  undefined4 uStack_b8;
  char file_description [7];
  int dimension;
  int precision;
  char contact_info [12];
  int i;
  int length;
  undefined4 uStack_94;
  char nul;
  int n_meshes;
  int revision_number;
  int magic_number;
  char cStack_84;
  char magic_string [7];
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nfaceid;
  REF_LONG ntet;
  REF_LONG ntri;
  REF_LONG nedg;
  REF_GLOB nnode;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  nnode = (REF_GLOB)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  uVar3 = ref_node_synchronize_globals((REF_NODE)nnode);
  if (uVar3 == 0) {
    nedg = *(REF_LONG *)(nnode + 0x68);
    uVar3 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x10),(REF_NODE)nnode,&ntri);
    if (uVar3 == 0) {
      uVar3 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x28),(REF_NODE)nnode,&ntet);
      if (uVar3 == 0) {
        uVar3 = ref_cell_ncell(*(REF_CELL *)(filename_local + 0x50),(REF_NODE)nnode,
                               (REF_LONG *)&min_faceid);
        if (uVar3 == 0) {
          if (*(int *)(filename_local + 0x108) == 0) {
            _cStack_84 = ref_grid_faceid_range
                                   ((REF_GRID)filename_local,&ref_private_macro_code_rss,
                                    &ref_private_macro_code_rss_1);
            if (_cStack_84 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x956,"ref_gather_avm",(ulong)_cStack_84,"range");
              uVar3._0_1_ = cStack_84;
              uVar3._1_1_ = magic_string[0];
              uVar3._2_1_ = magic_string[1];
              uVar3._3_1_ = magic_string[2];
              return uVar3;
            }
            _cStack_84 = 0;
          }
          else {
            magic_string._3_4_ =
                 ref_cell_id_range(*(REF_CELL *)(filename_local + 0x10),(REF_MPI)ref_node,
                                   &ref_private_macro_code_rss,&ref_private_macro_code_rss_1);
            if (magic_string._3_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x954,"ref_gather_avm",(ulong)(uint)magic_string._3_4_,"range");
              RVar5._0_1_ = magic_string[3];
              RVar5._1_1_ = magic_string[4];
              RVar5._2_1_ = magic_string[5];
              RVar5._3_1_ = magic_string[6];
              return RVar5;
            }
            magic_string[3] = '\0';
            magic_string[4] = '\0';
            magic_string[5] = '\0';
            magic_string[6] = '\0';
          }
          max_faceid = (ref_private_macro_code_rss_1 - ref_private_macro_code_rss) + 1;
          ref_mpi = (REF_MPI)0x0;
          if (ref_node->max == 0) {
            stack0xffffffffffffff75 = 0x454d5641;
            magic_number._1_2_ = 0x4853;
            magic_number._3_1_ = 0;
            n_meshes = 1;
            uStack_94 = 2;
            length = 1;
            i._3_1_ = 0;
            dimension._0_1_ = 'N';
            dimension._1_1_ = 'A';
            dimension._2_1_ = 'S';
            dimension._3_1_ = 'A';
            precision._0_1_ = '/';
            precision._1_1_ = 'r';
            precision._2_1_ = 'e';
            precision._3_1_ = 'f';
            builtin_strncpy(contact_info,"ine",4);
            file_description[3] = '\x02';
            file_description[4] = '\0';
            file_description[5] = '\0';
            file_description[6] = '\0';
            builtin_strncpy(local_bf,"refine",7);
            builtin_strncpy(mesh_type,"Sketch2S",8);
            coordinate_system[6] = 'u';
            builtin_strncpy(mesh_generator,"nstruc",7);
            _ref_point_desc = 0x69666572;
            coordinate_system[3] = 'n';
            coordinate_system[4] = 'e';
            coordinate_system[5] = '\0';
            memset(mesh_description + 0x11,0,1);
            model_scale = (double)0x6b53656e69666572;
            builtin_strncpy(mesh_description,"etch2Solution",0xe);
            mesh_units[4] = '\0';
            mesh_units[5] = '\0';
            mesh_units[6] = '\0';
            mesh_units[7] = '\0';
            mesh_units[8] = '\0';
            mesh_units[9] = '\0';
            mesh_units[10] = -0x10;
            mesh_units[0xb] = '?';
            element_scheme[4] = '\0';
            element_scheme[5] = '\0';
            element_scheme[6] = '\0';
            element_scheme[7] = '\0';
            ref_private_status_reis_ai._4_1_ = 'u';
            ref_private_status_reis_ai._5_1_ = 'n';
            ref_private_status_reis_ai._6_1_ = 'i';
            ref_private_status_reis_ai._7_1_ = 'f';
            faceid._0_1_ = 'o';
            faceid._1_1_ = 'r';
            faceid._2_1_ = 'm';
            faceid._3_1_ = '\0';
            ref_mpi = (REF_MPI)fopen((char *)file,"w");
            if ((FILE *)ref_mpi == (FILE *)0x0) {
              printf("unable to open %s\n",file);
            }
            if (ref_mpi == (REF_MPI)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x974,"ref_gather_avm","unable to open file");
              return 2;
            }
            ref_private_status_reis_bi = 6;
            ref_private_status_reis_ai_1 =
                 fwrite((void *)((long)&revision_number + 1),1,6,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi != ref_private_status_reis_ai_1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x976,"ref_gather_avm","magic_string",ref_private_status_reis_bi,
                     ref_private_status_reis_ai_1);
              return 1;
            }
            ref_private_status_reis_bi_1 = 1;
            ref_private_status_reis_ai_2 = fwrite(&n_meshes,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_1 != ref_private_status_reis_ai_2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x978,"ref_gather_avm","magic_number",ref_private_status_reis_bi_1,
                     ref_private_status_reis_ai_2);
              return 1;
            }
            ref_private_status_reis_bi_2 = 1;
            ref_private_status_reis_ai_3 = fwrite(&stack0xffffffffffffff6c,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_2 != ref_private_status_reis_ai_3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x97a,"ref_gather_avm","revision_number",ref_private_status_reis_bi_2,
                     ref_private_status_reis_ai_3);
              return 1;
            }
            ref_private_status_reis_bi_3 = 1;
            ref_private_status_reis_ai_4 = fwrite(&length,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_3 != ref_private_status_reis_ai_4) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x97b,"ref_gather_avm","n_meshes",ref_private_status_reis_bi_3,
                     ref_private_status_reis_ai_4);
              return 1;
            }
            sVar6 = strlen((char *)&dimension);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_4 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_5 =
                 fwrite(&dimension,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_4 != ref_private_status_reis_ai_5) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x97f,"ref_gather_avm","contact_info",ref_private_status_reis_bi_4,
                     ref_private_status_reis_ai_5);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_5 = 1;
              ref_private_status_reis_ai_6 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_5 != ref_private_status_reis_ai_6) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x982,"ref_gather_avm","nul",ref_private_status_reis_bi_5,
                       ref_private_status_reis_ai_6);
                return 1;
              }
            }
            ref_private_status_reis_bi_6 = 1;
            ref_private_status_reis_ai_7 =
                 fwrite((char *)((long)register0x00000020 + -0xb7) + 3,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_6 != ref_private_status_reis_ai_7) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x984,"ref_gather_avm","precision",ref_private_status_reis_bi_6,
                     ref_private_status_reis_ai_7);
              return 1;
            }
            uStack_b8 = 3;
            if (*(int *)(filename_local + 0x108) != 0) {
              uStack_b8 = 2;
            }
            ref_private_status_reis_bi_7 = 1;
            ref_private_status_reis_ai_8 = fwrite(&stack0xffffffffffffff48,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_7 != ref_private_status_reis_ai_8) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x986,"ref_gather_avm","dimension",ref_private_status_reis_bi_7,
                     ref_private_status_reis_ai_8);
              return 1;
            }
            sVar6 = strlen(local_bf);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_8 = 1;
            ref_private_status_reis_ai_9 = fwrite(contact_info + 8,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_8 != ref_private_status_reis_ai_9) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x988,"ref_gather_avm","length",ref_private_status_reis_bi_8,
                     ref_private_status_reis_ai_9);
              return 1;
            }
            ref_private_status_reis_bi_9 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_10 =
                 fwrite(local_bf,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_9 != ref_private_status_reis_ai_10) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x98b,"ref_gather_avm","file_description",ref_private_status_reis_bi_9,
                     ref_private_status_reis_ai_10);
              return 1;
            }
            sVar6 = strlen(mesh_type);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_10 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_11 =
                 fwrite(mesh_type,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_10 != ref_private_status_reis_ai_11) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x98e,"ref_gather_avm","mesh_name",ref_private_status_reis_bi_10,
                     ref_private_status_reis_ai_11);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_11 = 1;
              ref_private_status_reis_ai_12 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_11 != ref_private_status_reis_ai_12) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x991,"ref_gather_avm","nul",ref_private_status_reis_bi_11,
                       ref_private_status_reis_ai_12);
                return 1;
              }
            }
            sVar6 = strlen(coordinate_system + 6);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_12 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_13 =
                 fwrite(coordinate_system + 6,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_12 != ref_private_status_reis_ai_13) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x995,"ref_gather_avm","mesh_type",ref_private_status_reis_bi_12,
                     ref_private_status_reis_ai_13);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_13 = 1;
              ref_private_status_reis_ai_14 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_13 != ref_private_status_reis_ai_14) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x998,"ref_gather_avm","nul",ref_private_status_reis_bi_13,
                       ref_private_status_reis_ai_14);
                return 1;
              }
            }
            sVar6 = strlen(ref_point_desc);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_14 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_15 =
                 fwrite(ref_point_desc,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_14 != ref_private_status_reis_ai_15) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x99d,"ref_gather_avm","mesh_generator",ref_private_status_reis_bi_14,
                     ref_private_status_reis_ai_15);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_15 = 1;
              coord_system = (char *)fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if ((char *)ref_private_status_reis_bi_15 != coord_system) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9a0,"ref_gather_avm","nul",ref_private_status_reis_bi_15,coord_system);
                return 1;
              }
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              if ((*(long *)(*(long *)(filename_local + 0x98) + 0x90) != 0) &&
                 (ref_private_status_reis_ai_16._4_4_ =
                       ref_egads_get_attribute
                                 (*(REF_GEOM *)(filename_local + 0x98),3,-1,"av:coordinate_system",
                                  (char **)&ref_private_macro_code_rss_6),
                 ref_private_status_reis_ai_16._4_4_ == 0)) {
                ref_private_status_reis_ai_16._0_4_ =
                     ref_grid_parse_coordinate_system
                               ((REF_GRID)filename_local,_ref_private_macro_code_rss_6);
                if ((uint)ref_private_status_reis_ai_16 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x9ad,"ref_gather_avm",(ulong)(uint)ref_private_status_reis_ai_16,
                         "parse av coor sys");
                  return (uint)ref_private_status_reis_ai_16;
                }
                ref_private_status_reis_ai_16._0_4_ = 0;
              }
              switch(*(undefined4 *)(filename_local + 200)) {
              case 0:
                snprintf(mesh_description + 0x12,7,"xByRzU");
                break;
              case 1:
                snprintf(mesh_description + 0x12,7,"xByUzL");
                break;
              case 2:
                snprintf(mesh_description + 0x12,7,"xFyRzD");
                break;
              case 3:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9ba,"ref_gather_avm","REF_GRID_COORDSYS_LAST");
                return 1;
              }
            }
            else {
              snprintf(mesh_description + 0x12,7,"xByUzL");
            }
            sVar6 = strlen(mesh_description + 0x12);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_16 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_17 =
                 fwrite(mesh_description + 0x12,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_16 != ref_private_status_reis_ai_17) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9c0,"ref_gather_avm","coordinate_system",ref_private_status_reis_bi_16,
                     ref_private_status_reis_ai_17);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_17 = 1;
              ref_private_status_reis_ai_18 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_17 != ref_private_status_reis_ai_18) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9c3,"ref_gather_avm","nul",ref_private_status_reis_bi_17,
                       ref_private_status_reis_ai_18);
                return 1;
              }
            }
            ref_private_status_reis_bi_18 = 1;
            unit = (char *)fwrite(mesh_units + 4,8,1,(FILE *)ref_mpi);
            if ((char *)ref_private_status_reis_bi_18 != unit) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9c5,"ref_gather_avm","model_scale",ref_private_status_reis_bi_18,unit);
              return 1;
            }
            if ((*(long *)(*(long *)(filename_local + 0x98) + 0x90) != 0) &&
               (ref_private_status_reis_ai_19._4_4_ =
                     ref_egads_get_attribute
                               (*(REF_GEOM *)(filename_local + 0x98),3,-1,"av:mesh_units",
                                (char **)&ref_private_macro_code_rss_7),
               ref_private_status_reis_ai_19._4_4_ == 0)) {
              ref_private_status_reis_ai_19._0_4_ =
                   ref_grid_parse_unit((REF_GRID)filename_local,_ref_private_macro_code_rss_7);
              if ((uint)ref_private_status_reis_ai_19 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9cd,"ref_gather_avm",(ulong)(uint)ref_private_status_reis_ai_19,
                       "parse unit");
                return (uint)ref_private_status_reis_ai_19;
              }
              ref_private_status_reis_ai_19._0_4_ = 0;
            }
            switch(*(undefined4 *)(filename_local + 0xcc)) {
            case 0:
              snprintf((char *)&n_int,0xc,"in");
              break;
            case 1:
              snprintf((char *)&n_int,0xc,"ft");
              break;
            case 2:
              snprintf((char *)&n_int,0xc,"m");
              break;
            case 3:
              snprintf((char *)&n_int,0xc,"cm");
              break;
            case 4:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9dd,"ref_gather_avm","REF_GRID_UNIT_LAST");
              return 1;
            }
            sVar6 = strlen((char *)&n_int);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_19 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_20 =
                 fwrite(&n_int,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_19 != ref_private_status_reis_ai_20) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9e1,"ref_gather_avm","mesh_units",ref_private_status_reis_bi_19,
                     ref_private_status_reis_ai_20);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_20 = 1;
              reference = (REF_DBL *)fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if ((REF_DBL *)ref_private_status_reis_bi_20 != reference) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9e4,"ref_gather_avm","nul",ref_private_status_reis_bi_20,reference);
                return 1;
              }
            }
            if (((*(long *)(*(long *)(filename_local + 0x98) + 0x90) != 0) &&
                (ref_private_status_reis_ai_21._4_4_ =
                      ref_egads_get_real_attribute
                                (*(REF_GEOM *)(filename_local + 0x98),3,-1,"av:reference",
                                 &stack0xfffffffffffffd58,(REF_INT *)(contact_info + 8)),
                ref_private_status_reis_ai_21._4_4_ == 0)) && (contact_info._8_4_ == 7)) {
              contact_info[4] = '\0';
              contact_info[5] = '\0';
              contact_info[6] = '\0';
              contact_info[7] = '\0';
              for (; (int)contact_info._4_4_ < 7; contact_info._4_4_ = contact_info._4_4_ + 1) {
                *(REF_DBL *)(filename_local + (long)(int)contact_info._4_4_ * 8 + 0xd0) =
                     pRStack_2a8[(int)contact_info._4_4_];
              }
            }
            ref_private_status_reis_bi_21 = 7;
            ref_private_status_reis_ai_22 = fwrite(filename_local + 0xd0,8,7,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_21 != ref_private_status_reis_ai_22) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9f3,"ref_gather_avm","reference",ref_private_status_reis_bi_21,
                     ref_private_status_reis_ai_22);
              return 1;
            }
            sVar6 = strlen(mesh_description + 0x11);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_22 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_23 =
                 fwrite(mesh_description + 0x11,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_22 != ref_private_status_reis_ai_23) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9f7,"ref_gather_avm","ref_point_desc",ref_private_status_reis_bi_22,
                     ref_private_status_reis_ai_23);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_23 = 1;
              ref_private_status_reis_ai_24 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_23 != ref_private_status_reis_ai_24) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x9fa,"ref_gather_avm","nul",ref_private_status_reis_bi_23,
                       ref_private_status_reis_ai_24);
                return 1;
              }
            }
            ref_private_status_reis_bi_24 = 1;
            ref_private_status_reis_ai_25 = fwrite(element_scheme + 4,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_24 != ref_private_status_reis_ai_25) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x9fc,"ref_gather_avm","refined",ref_private_status_reis_bi_24,
                     ref_private_status_reis_ai_25);
              return 1;
            }
            sVar6 = strlen((char *)&model_scale);
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_25 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_26 =
                 fwrite(&model_scale,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_25 != ref_private_status_reis_ai_26) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa00,"ref_gather_avm","mesh_description",ref_private_status_reis_bi_25,
                     ref_private_status_reis_ai_26);
              return 1;
            }
            contact_info._8_4_ = 0x80 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              ref_private_status_reis_bi_26 = 1;
              ref_private_status_reis_ai_27 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_26 != ref_private_status_reis_ai_27) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa03,"ref_gather_avm","nul",ref_private_status_reis_bi_26,
                       ref_private_status_reis_ai_27);
                return 1;
              }
            }
            element_scheme._0_4_ = (undefined4)nedg;
            ref_private_status_reis_bi_27 = 1;
            ref_private_status_reis_ai_28 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_27 != ref_private_status_reis_ai_28) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa06,"ref_gather_avm","nodes",ref_private_status_reis_bi_27,
                     ref_private_status_reis_ai_28);
              return 1;
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              iVar4 = (int)ntet + (int)_min_faceid * 4;
            }
            else {
              iVar4 = (int)ntri + (int)ntet * 3;
            }
            element_scheme._0_4_ = iVar4 / 2;
            ref_private_status_reis_bi_28 = 1;
            ref_private_status_reis_ai_29 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_28 != ref_private_status_reis_ai_29) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa0c,"ref_gather_avm","nfaces",ref_private_status_reis_bi_28,
                     ref_private_status_reis_ai_29);
              return 1;
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              element_scheme._0_4_ = (undefined4)_min_faceid;
            }
            else {
              element_scheme._0_4_ = (undefined4)ntet;
            }
            ref_private_status_reis_bi_29 = 1;
            ref_private_status_reis_ai_30 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_29 != ref_private_status_reis_ai_30) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa12,"ref_gather_avm","ncells",ref_private_status_reis_bi_29,
                     ref_private_status_reis_ai_30);
              return 1;
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              element_scheme[0] = '\x03';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_33 = 1;
              ref_private_status_reis_ai_34 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_33 != ref_private_status_reis_ai_34) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa1c,"ref_gather_avm","max nodes per face",ref_private_status_reis_bi_33,
                       ref_private_status_reis_ai_34);
                return 1;
              }
              element_scheme[0] = '\x04';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_34 = 1;
              ref_private_status_reis_ai_35 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_34 != ref_private_status_reis_ai_35) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa1e,"ref_gather_avm","max nodes per cell",ref_private_status_reis_bi_34,
                       ref_private_status_reis_ai_35);
                return 1;
              }
              element_scheme[0] = '\x04';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_35 = 1;
              ref_private_status_reis_ai_36 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_35 != ref_private_status_reis_ai_36) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa20,"ref_gather_avm","max faces per cell",ref_private_status_reis_bi_35,
                       ref_private_status_reis_ai_36);
                return 1;
              }
            }
            else {
              element_scheme[0] = '\x02';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_30 = 1;
              ref_private_status_reis_ai_31 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_30 != ref_private_status_reis_ai_31) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa15,"ref_gather_avm","max nodes per face",ref_private_status_reis_bi_30,
                       ref_private_status_reis_ai_31);
                return 1;
              }
              element_scheme[0] = '\x03';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_31 = 1;
              ref_private_status_reis_ai_32 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_31 != ref_private_status_reis_ai_32) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa17,"ref_gather_avm","max nodes per cell",ref_private_status_reis_bi_31,
                       ref_private_status_reis_ai_32);
                return 1;
              }
              element_scheme[0] = '\x03';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_32 = 1;
              ref_private_status_reis_ai_33 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_32 != ref_private_status_reis_ai_33) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa19,"ref_gather_avm","max faces per cell",ref_private_status_reis_bi_32,
                       ref_private_status_reis_ai_33);
                return 1;
              }
            }
            sVar6 = strlen((char *)((long)&ref_private_status_reis_ai + 4));
            contact_info._8_4_ = (undefined4)sVar6;
            ref_private_status_reis_bi_36 = (REF_LONG)(int)contact_info._8_4_;
            ref_private_status_reis_ai_37 =
                 fwrite((void *)((long)&ref_private_status_reis_ai + 4),1,
                        (long)(int)contact_info._8_4_,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_36 != ref_private_status_reis_ai_37) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa25,"ref_gather_avm","element_scheme",ref_private_status_reis_bi_36,
                     ref_private_status_reis_ai_37);
              return 1;
            }
            contact_info._8_4_ = 0x20 - contact_info._8_4_;
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            while( true ) {
              if ((int)contact_info._8_4_ <= (int)contact_info._4_4_) break;
              ref_private_status_reis_bi_37 = 1;
              ref_private_status_reis_ai_38 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
              if (ref_private_status_reis_bi_37 != ref_private_status_reis_ai_38) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa28,"ref_gather_avm","nul",ref_private_status_reis_bi_37,
                       ref_private_status_reis_ai_38);
                return 1;
              }
              contact_info._4_4_ = contact_info._4_4_ + 1;
            }
            element_scheme[0] = '\x01';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_38 = 1;
            ref_private_status_reis_ai_39 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_38 != ref_private_status_reis_ai_39) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa2b,"ref_gather_avm","face polynomial order",ref_private_status_reis_bi_38,
                     ref_private_status_reis_ai_39);
              return 1;
            }
            element_scheme[0] = '\x01';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_39 = 1;
            ref_private_status_reis_ai_40 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_39 != ref_private_status_reis_ai_40) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa2d,"ref_gather_avm","cell polynomial order",ref_private_status_reis_bi_39,
                     ref_private_status_reis_ai_40);
              return 1;
            }
            element_scheme[0] = (undefined1)max_faceid;
            element_scheme[1] = max_faceid._1_1_;
            element_scheme[2] = max_faceid._2_1_;
            element_scheme[3] = max_faceid._3_1_;
            ref_private_status_reis_bi_40 = 1;
            ref_private_status_reis_ai_41 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_40 != ref_private_status_reis_ai_41) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa2f,"ref_gather_avm","# boundary patches",ref_private_status_reis_bi_40,
                     ref_private_status_reis_ai_41);
              return 1;
            }
            element_scheme[0] = '\0';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_41 = 1;
            ref_private_status_reis_ai_42 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_41 != ref_private_status_reis_ai_42) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa31,"ref_gather_avm","nhex",ref_private_status_reis_bi_41,
                     ref_private_status_reis_ai_42);
              return 1;
            }
            element_scheme._0_4_ = (undefined4)ntet;
            if (*(int *)(filename_local + 0x108) == 0) {
              element_scheme._0_4_ = min_faceid;
            }
            ref_private_status_reis_bi_42 = 1;
            ref_private_status_reis_ai_43 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_42 != ref_private_status_reis_ai_43) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa37,"ref_gather_avm","ntet",ref_private_status_reis_bi_42,
                     ref_private_status_reis_ai_43);
              return 1;
            }
            element_scheme[0] = '\0';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_43 = 1;
            ref_private_status_reis_ai_44 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_43 != ref_private_status_reis_ai_44) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa39,"ref_gather_avm","npri",ref_private_status_reis_bi_43,
                     ref_private_status_reis_ai_44);
              return 1;
            }
            element_scheme[0] = '\0';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_44 = 1;
            ref_private_status_reis_ai_45 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_44 != ref_private_status_reis_ai_45) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa3b,"ref_gather_avm","npyr",ref_private_status_reis_bi_44,
                     ref_private_status_reis_ai_45);
              return 1;
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              element_scheme[0] = (char)ntet;
              element_scheme[1] = ntet._1_1_;
              element_scheme[2] = ntet._2_1_;
              element_scheme[3] = ntet._3_1_;
            }
            else {
              element_scheme[0] = (char)ntri;
              element_scheme[1] = ntri._1_1_;
              element_scheme[2] = ntri._2_1_;
              element_scheme[3] = ntri._3_1_;
            }
            ref_private_status_reis_bi_45 = 1;
            ref_private_status_reis_ai_46 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_45 != ref_private_status_reis_ai_46) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa41,"ref_gather_avm","# boundary tri faces",ref_private_status_reis_bi_45,
                     ref_private_status_reis_ai_46);
              return 1;
            }
            ref_private_status_reis_bi_46 = 1;
            ref_private_status_reis_ai_47 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_46 != ref_private_status_reis_ai_47) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa42,"ref_gather_avm","# tri faces",ref_private_status_reis_bi_46,
                     ref_private_status_reis_ai_47);
              return 1;
            }
            element_scheme[0] = '\0';
            element_scheme[1] = '\0';
            element_scheme[2] = '\0';
            element_scheme[3] = '\0';
            ref_private_status_reis_bi_47 = 1;
            ref_private_status_reis_ai_48 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_47 != ref_private_status_reis_ai_48) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa44,"ref_gather_avm","# boundary quad faces",ref_private_status_reis_bi_47,
                     ref_private_status_reis_ai_48);
              return 1;
            }
            ref_private_status_reis_bi_48 = 1;
            ref_private_status_reis_ai_49 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
            if (ref_private_status_reis_bi_48 != ref_private_status_reis_ai_49) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xa45,"ref_gather_avm","# quad faces",ref_private_status_reis_bi_48,
                     ref_private_status_reis_ai_49);
              return 1;
            }
            contact_info[8] = '\x05';
            contact_info[9] = '\0';
            contact_info[10] = '\0';
            contact_info[0xb] = '\0';
            contact_info[4] = '\0';
            contact_info[5] = '\0';
            contact_info[6] = '\0';
            contact_info[7] = '\0';
            for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                contact_info._4_4_ = contact_info._4_4_ + 1) {
              element_scheme[0] = '\0';
              element_scheme[1] = '\0';
              element_scheme[2] = '\0';
              element_scheme[3] = '\0';
              ref_private_status_reis_bi_49 = 1;
              ref_geom = (REF_GEOM)fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if ((REF_GEOM)ref_private_status_reis_bi_49 != ref_geom) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa49,"ref_gather_avm","zeros",ref_private_status_reis_bi_49,ref_geom);
                return 1;
              }
            }
            for (ref_private_status_reis_ai._0_4_ = ref_private_macro_code_rss;
                (int)(uint)ref_private_status_reis_ai <= ref_private_macro_code_rss_1;
                ref_private_status_reis_ai._0_4_ = (uint)ref_private_status_reis_ai + 1) {
              patch_label = *(char **)(filename_local + 0x98);
              stack0xfffffffffffffb60 = "unknown";
              ref_private_status_reis_ai_50._0_4_ = 2;
              if (*(int *)(filename_local + 0x108) != 0) {
                ref_private_status_reis_ai_50._0_4_ = 1;
              }
              RVar5 = ref_egads_get_attribute
                                ((REF_GEOM)patch_label,(REF_INT)ref_private_status_reis_ai_50,
                                 (uint)ref_private_status_reis_ai,"av:patch_label",&patch_type);
              if (RVar5 != 0) {
                patch_type = "unknown";
              }
              snprintf((char *)&ref_geom_type,0x21,"%s-%d",patch_type,
                       (ulong)(uint)ref_private_status_reis_ai);
              sVar6 = strlen((char *)&ref_geom_type);
              contact_info._8_4_ = (undefined4)sVar6;
              sVar6 = (size_t)(int)contact_info._8_4_;
              sVar7 = fwrite(&ref_geom_type,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
              if (sVar6 != sVar7) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa5a,"ref_gather_avm","patch_label",sVar6,sVar7);
                return 1;
              }
              contact_info._8_4_ = 0x20 - contact_info._8_4_;
              contact_info[4] = '\0';
              contact_info[5] = '\0';
              contact_info[6] = '\0';
              contact_info[7] = '\0';
              for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                  contact_info._4_4_ = contact_info._4_4_ + 1) {
                sVar6 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xa5d,"ref_gather_avm","nul",1,sVar6);
                  return 1;
                }
              }
              RVar5 = ref_egads_get_attribute
                                ((REF_GEOM)patch_label,(REF_INT)ref_private_status_reis_ai_50,
                                 (uint)ref_private_status_reis_ai,"av:patch_type",
                                 &unknown_patch_type);
              if ((RVar5 != 0) || (unknown_patch_type == (char *)0x0)) {
                unknown_patch_type = stack0xfffffffffffffb60;
              }
              sVar6 = strlen(unknown_patch_type);
              contact_info._8_4_ = (undefined4)sVar6;
              sVar6 = (size_t)(int)contact_info._8_4_;
              sVar7 = fwrite(unknown_patch_type,1,(long)(int)contact_info._8_4_,(FILE *)ref_mpi);
              if (sVar6 != sVar7) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa66,"ref_gather_avm","patch_label",sVar6,sVar7);
                return 1;
              }
              contact_info._8_4_ = 0x10 - contact_info._8_4_;
              contact_info[4] = '\0';
              contact_info[5] = '\0';
              contact_info[6] = '\0';
              contact_info[7] = '\0';
              for (; (int)contact_info._4_4_ < (int)contact_info._8_4_;
                  contact_info._4_4_ = contact_info._4_4_ + 1) {
                sVar6 = fwrite((void *)((long)&i + 3),1,1,(FILE *)ref_mpi);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xa69,"ref_gather_avm","nul",1,sVar6);
                  return 1;
                }
              }
              element_scheme._0_4_ = -(uint)ref_private_status_reis_ai;
              sVar6 = fwrite(element_scheme,4,1,(FILE *)ref_mpi);
              if (sVar6 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa6c,"ref_gather_avm","patch ID",1,sVar6);
                return 1;
              }
            }
          }
          uVar3 = ref_gather_node((REF_NODE)nnode,0,0,0,(FILE *)ref_mpi);
          if (uVar3 == 0) {
            if (*(int *)(filename_local + 0x108) == 0) {
              pRVar2 = *(REF_CELL *)(filename_local + 0x28);
              for (local_588 = 0; local_588 < pRVar2->max; local_588 = local_588 + 1) {
                if (((-1 < local_588) && (local_588 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * local_588] != -1)) {
                  pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_588] =
                       -pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_588];
                }
              }
              uVar3 = ref_gather_cell((REF_NODE)nnode,pRVar2,0,1,0,0,0,0,0,(FILE *)ref_mpi);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa9f,"ref_gather_avm",(ulong)uVar3,"nodes");
                return uVar3;
              }
              for (local_588 = 0; local_588 < pRVar2->max; local_588 = local_588 + 1) {
                if (((-1 < local_588) && (local_588 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * local_588] != -1)) {
                  pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_588] =
                       -pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_588];
                }
              }
            }
            else {
              pRVar2 = *(REF_CELL *)(filename_local + 0x10);
              for (local_558 = 0; local_558 < pRVar2->max; local_558 = local_558 + 1) {
                if (((-1 < local_558) && (local_558 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * local_558] != -1)) {
                  pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_558] =
                       -pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_558];
                }
              }
              uVar3 = ref_gather_cell((REF_NODE)nnode,pRVar2,0,1,0,0,0,0,1,(FILE *)ref_mpi);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xa89,"ref_gather_avm",(ulong)uVar3,"nodes");
                return uVar3;
              }
              for (local_558 = 0; local_558 < pRVar2->max; local_558 = local_558 + 1) {
                if (((-1 < local_558) && (local_558 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * local_558] != -1)) {
                  pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_558] =
                       -pRVar2->c2n[pRVar2->node_per + pRVar2->size_per * local_558];
                }
              }
            }
            if (*(int *)(filename_local + 0x108) == 0) {
              uVar3 = ref_gather_cell((REF_NODE)nnode,*(REF_CELL *)(filename_local + 0x50),0,0,0,0,0
                                      ,0,0,(FILE *)ref_mpi);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xacc,"ref_gather_avm",(ulong)uVar3,"nodes");
                return uVar3;
              }
            }
            else {
              pRVar2 = *(REF_CELL *)(filename_local + 0x28);
              for (ref_private_macro_code_rss_11 = 0; ref_private_macro_code_rss_11 < pRVar2->max;
                  ref_private_macro_code_rss_11 = ref_private_macro_code_rss_11 + 1) {
                if (((-1 < ref_private_macro_code_rss_11) &&
                    (ref_private_macro_code_rss_11 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11] != -1)) {
                  RVar1 = pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 2];
                  pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 2] =
                       pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 1];
                  pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 1] = RVar1;
                }
              }
              uVar3 = ref_gather_cell((REF_NODE)nnode,pRVar2,0,0,0,0,0,0,1,(FILE *)ref_mpi);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xab9,"ref_gather_avm",(ulong)uVar3,"nodes");
                return uVar3;
              }
              for (ref_private_macro_code_rss_11 = 0; ref_private_macro_code_rss_11 < pRVar2->max;
                  ref_private_macro_code_rss_11 = ref_private_macro_code_rss_11 + 1) {
                if (((-1 < ref_private_macro_code_rss_11) &&
                    (ref_private_macro_code_rss_11 < pRVar2->max)) &&
                   (pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11] != -1)) {
                  RVar1 = pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 2];
                  pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 2] =
                       pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 1];
                  pRVar2->c2n[pRVar2->size_per * ref_private_macro_code_rss_11 + 1] = RVar1;
                }
              }
            }
            if (ref_node->max == 0) {
              fclose((FILE *)ref_mpi);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xa75,"ref_gather_avm",(ulong)uVar3,"nodes");
            ref_grid_local._4_4_ = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x950,"ref_gather_avm",(ulong)uVar3,"ntet");
          ref_grid_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x94f,"ref_gather_avm",(ulong)uVar3,"ntri");
        ref_grid_local._4_4_ = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x94e,"ref_gather_avm",(ulong)uVar3,"nedg");
      ref_grid_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x94b,
           "ref_gather_avm",(ulong)uVar3,"sync");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_avm(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *file;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB nnode;
  REF_LONG nedg, ntri, ntet;
  REF_INT nfaceid, min_faceid, max_faceid;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = ref_node_n_global(ref_node);
  RSS(ref_cell_ncell(ref_grid_edg(ref_grid), ref_node, &nedg), "nedg");
  RSS(ref_cell_ncell(ref_grid_tri(ref_grid), ref_node, &ntri), "ntri");
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  if (ref_grid_twod(ref_grid)) {
    RSS(ref_cell_id_range(ref_grid_edg(ref_grid), ref_mpi, &min_faceid,
                          &max_faceid),
        "range");
  } else {
    RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
  }
  nfaceid = max_faceid - min_faceid + 1;

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    char magic_string[] = "AVMESH";
    int magic_number = 1;
    int revision_number = 2;
    int n_meshes = 1;
    char nul = '\0';
    int length, i;
    char contact_info[] = "NASA/refine";
    int precision = 2;
    int dimension;
    char file_description[] = "refine";
    char mesh_name[] = "Sketch2Solution";
    char mesh_type[] = "unstruc";
    char mesh_generator[] = "refine";
    char coordinate_system[7];
    char ref_point_desc[] = "";
    char mesh_description[] = "refineSketch2Solution";
    double model_scale = 1.0;
    char mesh_units[12];
    int refined = 0;
    int n_int;
    char element_scheme[] = "uniform";
    int faceid;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(6, fwrite(magic_string, sizeof(char), 6, file), "magic_string");
    REIS(1, fwrite(&magic_number, sizeof(magic_number), 1, file),
         "magic_number");
    REIS(1, fwrite(&revision_number, sizeof(revision_number), 1, file),
         "revision_number");
    REIS(1, fwrite(&n_meshes, sizeof(n_meshes), 1, file), "n_meshes");
    length = (int)strlen(contact_info);
    REIS(length,
         fwrite(contact_info, sizeof(char), (unsigned long)length, file),
         "contact_info");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    REIS(1, fwrite(&precision, sizeof(precision), 1, file), "precision");
    dimension = (ref_grid_twod(ref_grid) ? 2 : 3);
    REIS(1, fwrite(&dimension, sizeof(dimension), 1, file), "dimension");
    length = (int)strlen(file_description);
    REIS(1, fwrite(&length, sizeof(length), 1, file), "length");
    REIS(length,
         fwrite(file_description, sizeof(char), (unsigned long)length, file),
         "file_description");
    length = (int)strlen(mesh_name);
    REIS(length, fwrite(mesh_name, sizeof(char), (unsigned long)length, file),
         "mesh_name");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    length = (int)strlen(mesh_type);
    REIS(length, fwrite(mesh_type, sizeof(char), (unsigned long)length, file),
         "mesh_type");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    length = (int)strlen(mesh_generator);
    REIS(length,
         fwrite(mesh_generator, sizeof(char), (unsigned long)length, file),
         "mesh_generator");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    if (ref_grid_twod(ref_grid)) {
      snprintf(coordinate_system, 7, "xByUzL"); /* 2D: always xByUzL */
    } else {
      if (ref_geom_model_loaded(ref_grid_geom(ref_grid))) {
        const char *coord_system;
        REF_STATUS ref_status;
        ref_status = ref_egads_get_attribute(
            ref_grid_geom(ref_grid), REF_GEOM_BODY, REF_EMPTY,
            "av:coordinate_system", &coord_system);
        if (REF_SUCCESS == ref_status)
          RSS(ref_grid_parse_coordinate_system(ref_grid, coord_system),
              "parse av coor sys");
      }
      switch (ref_grid_coordinate_system(ref_grid)) {
        case REF_GRID_XBYRZU:
          snprintf(coordinate_system, 7, "xByRzU");
          break;
        case REF_GRID_XBYUZL:
          snprintf(coordinate_system, 7, "xByUzL");
          break;
        case REF_GRID_XFYRZD:
          snprintf(coordinate_system, 7, "xFyRzD");
          break;
        case REF_GRID_COORDSYS_LAST:
          THROW("REF_GRID_COORDSYS_LAST");
      }
    }
    length = (int)strlen(coordinate_system);
    REIS(length,
         fwrite(coordinate_system, sizeof(char), (unsigned long)length, file),
         "coordinate_system");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    REIS(1, fwrite(&model_scale, sizeof(model_scale), 1, file), "model_scale");
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid))) {
      const char *unit;
      REF_STATUS ref_status;
      ref_status =
          ref_egads_get_attribute(ref_grid_geom(ref_grid), REF_GEOM_BODY,
                                  REF_EMPTY, "av:mesh_units", &unit);
      if (REF_SUCCESS == ref_status)
        RSS(ref_grid_parse_unit(ref_grid, unit), "parse unit");
    }
    switch (ref_grid_unit(ref_grid)) {
      case REF_GRID_IN:
        snprintf(mesh_units, 12, "in");
        break;
      case REF_GRID_FT:
        snprintf(mesh_units, 12, "ft");
        break;
      case REF_GRID_M:
        snprintf(mesh_units, 12, "m");
        break;
      case REF_GRID_CM:
        snprintf(mesh_units, 12, "cm");
        break;
      case REF_GRID_UNIT_LAST:
        THROW("REF_GRID_UNIT_LAST");
    }
    length = (int)strlen(mesh_units);
    REIS(length, fwrite(mesh_units, sizeof(char), (unsigned long)length, file),
         "mesh_units");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid))) {
      const REF_DBL *reference;
      REF_STATUS ref_status;
      ref_status = ref_egads_get_real_attribute(
          ref_grid_geom(ref_grid), REF_GEOM_BODY, REF_EMPTY, "av:reference",
          &reference, &length);
      if (REF_SUCCESS == ref_status && 7 == length) {
        for (i = 0; i < length; i++) {
          ref_grid_reference(ref_grid, i) = reference[i];
        }
      }
    }
    REIS(7, fwrite(&ref_grid_reference(ref_grid, 0), sizeof(double), 7, file),
         "reference");
    length = (int)strlen(ref_point_desc);
    REIS(length,
         fwrite(ref_point_desc, sizeof(char), (unsigned long)length, file),
         "ref_point_desc");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    REIS(1, fwrite(&refined, sizeof(refined), 1, file), "refined");
    length = (int)strlen(mesh_description);
    REIS(length,
         fwrite(mesh_description, sizeof(char), (unsigned long)length, file),
         "mesh_description");
    length = 128 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    n_int = (int)nnode;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "nodes");
    if (ref_grid_twod(ref_grid)) {
      n_int = ((int)nedg + 3 * (int)ntri) / 2;
    } else {
      n_int = ((int)ntri + 4 * (int)ntet) / 2;
    }
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "nfaces");
    if (ref_grid_twod(ref_grid)) {
      n_int = (int)ntri;
    } else {
      n_int = (int)ntet;
    }
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "ncells");
    if (ref_grid_twod(ref_grid)) {
      n_int = 2;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max nodes per face");
      n_int = 3;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max nodes per cell");
      n_int = 3;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max faces per cell");
    } else {
      n_int = 3;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max nodes per face");
      n_int = 4;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max nodes per cell");
      n_int = 4;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "max faces per cell");
    }
    length = (int)strlen(element_scheme);
    REIS(length,
         fwrite(element_scheme, sizeof(char), (unsigned long)length, file),
         "element_scheme");
    length = 32 - length;
    for (i = 0; i < length; i++) {
      REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
    }
    n_int = 1;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "face polynomial order");
    n_int = 1;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "cell polynomial order");
    n_int = nfaceid;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "# boundary patches");
    n_int = 0;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "nhex");
    if (ref_grid_twod(ref_grid)) {
      n_int = (int)ntri;
    } else {
      n_int = (int)ntet;
    }
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "ntet");
    n_int = 0;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "npri");
    n_int = 0;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "npyr");
    if (ref_grid_twod(ref_grid)) {
      n_int = (int)nedg;
    } else {
      n_int = (int)ntri;
    }
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "# boundary tri faces");
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "# tri faces");
    n_int = 0;
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "# boundary quad faces");
    REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "# quad faces");
    length = 5;
    for (i = 0; i < length; i++) {
      n_int = 0;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "zeros");
    }
    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      REF_GEOM ref_geom = ref_grid_geom(ref_grid);
      const char *patch_label, *patch_type;
      const char *unknown_patch_type = "unknown";
      char patch_label_index[33];
      REF_STATUS ref_status;
      REF_INT ref_geom_type = REF_GEOM_FACE;
      if (ref_grid_twod(ref_grid)) ref_geom_type = REF_GEOM_EDGE;
      ref_status = ref_egads_get_attribute(ref_geom, ref_geom_type, faceid,
                                           "av:patch_label", &patch_label);
      if (REF_SUCCESS != ref_status) patch_label = "unknown";
      snprintf(patch_label_index, 33, "%s-%d", patch_label, faceid);
      length = (int)strlen(patch_label_index);
      REIS(length,
           fwrite(patch_label_index, sizeof(char), (unsigned long)length, file),
           "patch_label");
      length = 32 - length;
      for (i = 0; i < length; i++) {
        REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
      }
      ref_status = ref_egads_get_attribute(ref_geom, ref_geom_type, faceid,
                                           "av:patch_type", &patch_type);
      if (REF_SUCCESS != ref_status || NULL == patch_type)
        patch_type = unknown_patch_type;
      length = (int)strlen(patch_type);
      REIS(length,
           fwrite(patch_type, sizeof(char), (unsigned long)length, file),
           "patch_label");
      length = 16 - length;
      for (i = 0; i < length; i++) {
        REIS(1, fwrite(&nul, sizeof(nul), 1, file), "nul");
      }
      n_int = -faceid;
      REIS(1, fwrite(&n_int, sizeof(n_int), 1, file), "patch ID");
    }
  }

  {
    REF_BOOL swap_endian = REF_FALSE;
    REF_INT version = 0; /* meshb version, zero is no id */
    /* twod still has 3 coordinates, with z coordinate ignored/set to zero */
    REF_BOOL twod = REF_FALSE;
    RSS(ref_gather_node(ref_node, swap_endian, version, twod, file), "nodes");
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell = ref_grid_edg(ref_grid);
    REF_BOOL faceid_insted_of_c2n = REF_FALSE;
    REF_BOOL always_id = REF_TRUE;
    REF_BOOL swap_endian = REF_FALSE;
    REF_BOOL sixty_four_bit = REF_FALSE;
    REF_BOOL select_faceid = REF_FALSE;
    REF_INT faceid = 0;
    REF_BOOL pad = REF_TRUE;
    REF_INT cell;
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, always_id,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "nodes");
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
  } else {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_BOOL faceid_insted_of_c2n = REF_FALSE;
    REF_BOOL always_id = REF_TRUE;
    REF_BOOL swap_endian = REF_FALSE;
    REF_BOOL sixty_four_bit = REF_FALSE;
    REF_BOOL select_faceid = REF_FALSE;
    REF_INT faceid = 0;
    REF_BOOL pad = REF_FALSE;
    REF_INT cell;
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, always_id,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "nodes");
    each_ref_cell_valid_cell(ref_cell, cell) {
      ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell) =
          -ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
  }

  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_BOOL faceid_insted_of_c2n = REF_FALSE;
    REF_BOOL always_id = REF_FALSE;
    REF_BOOL swap_endian = REF_FALSE;
    REF_BOOL sixty_four_bit = REF_FALSE;
    REF_BOOL select_faceid = REF_FALSE;
    REF_INT faceid = 0;
    REF_BOOL pad = REF_TRUE;
    REF_INT cell, temp_node;
    /* avm winds tri different than EGADS */
    each_ref_cell_valid_cell(ref_cell, cell) {
      temp_node = ref_cell_c2n(ref_cell, 2, cell);
      ref_cell_c2n(ref_cell, 2, cell) = ref_cell_c2n(ref_cell, 1, cell);
      ref_cell_c2n(ref_cell, 1, cell) = temp_node;
    }
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, always_id,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "nodes");
    /* wind back (flip) after write */
    each_ref_cell_valid_cell(ref_cell, cell) {
      temp_node = ref_cell_c2n(ref_cell, 2, cell);
      ref_cell_c2n(ref_cell, 2, cell) = ref_cell_c2n(ref_cell, 1, cell);
      ref_cell_c2n(ref_cell, 1, cell) = temp_node;
    }
  } else {
    REF_CELL ref_cell = ref_grid_tet(ref_grid);
    REF_BOOL faceid_insted_of_c2n = REF_FALSE;
    REF_BOOL always_id = REF_FALSE;
    REF_BOOL swap_endian = REF_FALSE;
    REF_BOOL sixty_four_bit = REF_FALSE;
    REF_BOOL select_faceid = REF_FALSE;
    REF_INT faceid = 0;
    REF_BOOL pad = REF_FALSE;
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, always_id,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "nodes");
  }

  if (ref_mpi_once(ref_mpi)) fclose(file);
  return REF_SUCCESS;
}